

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O0

void adjust_gcvalues_joinstyle(XGCValues *values,unsigned_long *mask,Am_Join_Style_Flag join)

{
  Am_Join_Style_Flag join_local;
  unsigned_long *mask_local;
  XGCValues *values_local;
  
  if (join == Am_JOIN_MITER) {
    if (values->join_style != 0) {
      *mask = *mask | 0x80;
      values->join_style = 0;
    }
  }
  else if (join == Am_JOIN_ROUND) {
    if (values->join_style != 1) {
      *mask = *mask | 0x80;
      values->join_style = 1;
    }
  }
  else if ((join == Am_JOIN_BEVEL) && (values->join_style != 2)) {
    *mask = *mask | 0x80;
    values->join_style = 2;
  }
  return;
}

Assistant:

inline void
adjust_gcvalues_joinstyle(XGCValues &values, unsigned long &mask,
                          Am_Join_Style_Flag join)
{
  switch (join) {
  case Am_JOIN_MITER:
    if (values.join_style != JoinMiter) {
      mask |= GCJoinStyle;
      values.join_style = JoinMiter;
    }
    break;
  case Am_JOIN_ROUND:
    if (values.join_style != JoinRound) {
      mask |= GCJoinStyle;
      values.join_style = JoinRound;
    }
    break;
  case Am_JOIN_BEVEL:
    if (values.join_style != JoinBevel) {
      mask |= GCJoinStyle;
      values.join_style = JoinBevel;
    }
    break;
  }
}